

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O0

ElemMat * __thiscall lf::assemble::test::MVMultAssembler::Eval(MVMultAssembler *this,Entity *cell)

{
  RefElType RVar1;
  int iVar2;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  stringstream local_298 [8];
  stringstream ss;
  ostream local_288 [376];
  DiagonalReturnType local_110;
  double local_100;
  Scalar local_f8;
  ConstantReturnType local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_e0;
  Scalar local_b0;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_a8 [16];
  DiagonalReturnType local_98;
  double local_88;
  Scalar local_80;
  ConstantReturnType local_78;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_68;
  Scalar local_38;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_30 [19];
  RefEl local_1d;
  uint local_1c;
  RefEl ref_el;
  Entity *pEStack_18;
  glb_idx_t cell_idx;
  Entity *cell_local;
  MVMultAssembler *this_local;
  
  pEStack_18 = cell;
  local_1c = (*this->mesh_->_vptr_Mesh[5])(this->mesh_,cell);
  iVar2 = (*pEStack_18->_vptr_Entity[4])();
  local_1d.type_ = (RefElType)iVar2;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_1d);
  if (RVar1 == kTria) {
    local_38 = -1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Constant
              ((ConstantReturnType *)local_30,3,3,&local_38);
    Eigen::Matrix<double,-1,-1,1,4,4>::operator=((Matrix<double,_1,_1,1,4,4> *)&this->mat_,local_30)
    ;
    local_80 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Constant(&local_78,3,&local_80);
    local_88 = (double)local_1c;
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
    ::operator*(&local_68,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                 *)&local_78,&local_88);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>_>::diagonal
              (&local_98,(MatrixBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> *)&this->mat_);
    Eigen::Diagonal<Eigen::Matrix<double,-1,-1,1,4,4>,0>::operator=
              ((Diagonal<Eigen::Matrix<double,_1,_1,1,4,4>,0> *)&local_98,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_68);
  }
  else {
    if (RVar1 != kQuad) {
      std::__cxx11::stringstream::stringstream(local_298);
      std::operator<<(local_288,"Illegal cell type");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"false",&local_2c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                 ,&local_2f1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_2c8,&local_2f0,0x29b,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"false",&local_339);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                 ,&local_361);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"",&local_389);
      lf::base::AssertionFailed(&local_338,&local_360,0x29b,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator(&local_389);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator(&local_361);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator(&local_339);
      abort();
    }
    local_b0 = -1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Constant
              ((ConstantReturnType *)local_a8,4,4,&local_b0);
    Eigen::Matrix<double,-1,-1,1,4,4>::operator=((Matrix<double,_1,_1,1,4,4> *)&this->mat_,local_a8)
    ;
    local_f8 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Constant(&local_f0,4,&local_f8);
    local_100 = (double)local_1c;
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
    ::operator*(&local_e0,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
                 *)&local_f0,&local_100);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_4,_4>_>::diagonal
              (&local_110,(MatrixBase<Eigen::Matrix<double,__1,__1,_1,_4,_4>_> *)&this->mat_);
    Eigen::Diagonal<Eigen::Matrix<double,-1,-1,1,4,4>,0>::operator=
              ((Diagonal<Eigen::Matrix<double,_1,_1,1,4,4>,0> *)&local_110,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *)&local_e0);
  }
  return &this->mat_;
}

Assistant:

MVMultAssembler::ElemMat &MVMultAssembler::Eval(const lf::mesh::Entity &cell) {
  const lf::base::glb_idx_t cell_idx = mesh_.Index(cell);
  const lf::base::RefEl ref_el = cell.RefEl();
  switch (ref_el) {
    case lf::base::RefEl::kTria(): {
      mat_ = Eigen::Matrix3d::Constant(3, 3, -1.0);
      mat_.diagonal() = (Eigen::Vector3d::Constant(3, 1.0) * (double)cell_idx);
      break;
    }
    case lf::base::RefEl::kQuad(): {
      mat_ = Eigen::Matrix4d::Constant(4, 4, -1.0);
      mat_.diagonal() = (Eigen::Vector4d::Constant(4, 1.0) * (double)cell_idx);
      break;
    }
    default: {
      LF_ASSERT_MSG(false, "Illegal cell type");
      break;
    }
  }  // end switch
  return mat_;
}